

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

void __thiscall
flatbuffers::FlatCompiler::AnnotateBinaries
          (FlatCompiler *this,uint8_t *binary_schema,uint64_t binary_schema_size,
          FlatCOptions *options)

{
  pointer pbVar1;
  _Alloc_hider binary;
  size_type binary_length;
  bool bVar2;
  pointer __rhs;
  allocator<char> local_291;
  FlatCOptions *local_290;
  string binary_contents;
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  annotations;
  string local_210;
  Options text_gen_opts;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  local_1a0;
  BinaryAnnotator binary_annotator;
  AnnotatedBinaryTextGenerator text_generator;
  
  pbVar1 = (options->filenames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_290 = options;
  for (__rhs = (options->filenames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
    binary_contents._M_dataplus._M_p = (pointer)&binary_contents.field_2;
    binary_contents._M_string_length = 0;
    binary_contents.field_2._M_local_buf[0] = '\0';
    bVar2 = LoadFile((__rhs->_M_dataplus)._M_p,true,&binary_contents);
    binary_length = binary_contents._M_string_length;
    binary._M_p = binary_contents._M_dataplus._M_p;
    if (bVar2) {
      BinaryAnnotator::BinaryAnnotator
                (&binary_annotator,binary_schema,binary_schema_size,
                 (uint8_t *)binary_contents._M_dataplus._M_p,binary_contents._M_string_length,
                 (local_290->opts).size_prefixed);
      BinaryAnnotator::Annotate(&annotations,&binary_annotator);
      AnnotatedBinaryTextGenerator::Options::Options(&text_gen_opts);
      text_gen_opts.include_vector_contents = local_290->annotate_include_vector_contents;
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
      ::_Rb_tree(&local_1a0,&annotations._M_t);
      AnnotatedBinaryTextGenerator::AnnotatedBinaryTextGenerator
                (&text_generator,&text_gen_opts,
                 (map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                  *)&local_1a0,(uint8_t *)binary._M_p,binary_length);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
      ::~_Rb_tree(&local_1a0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"",&local_291);
      AnnotatedBinaryTextGenerator::Generate
                (&text_generator,__rhs,&options->annotate_schema,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      AnnotatedBinaryTextGenerator::~AnnotatedBinaryTextGenerator(&text_generator);
      AnnotatedBinaryTextGenerator::Options::~Options(&text_gen_opts);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
      ::~_Rb_tree(&annotations._M_t);
      BinaryAnnotator::~BinaryAnnotator(&binary_annotator);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &binary_annotator,"unable to load binary file: ",__rhs);
      (*(this->params_).warn_fn)(this,(string *)&binary_annotator,true);
      std::__cxx11::string::~string((string *)&binary_annotator);
    }
    std::__cxx11::string::~string((string *)&binary_contents);
  }
  return;
}

Assistant:

void FlatCompiler::AnnotateBinaries(const uint8_t *binary_schema,
                                    const uint64_t binary_schema_size,
                                    const FlatCOptions &options) {
  const std::string &schema_filename = options.annotate_schema;

  for (const std::string &filename : options.filenames) {
    std::string binary_contents;
    if (!flatbuffers::LoadFile(filename.c_str(), true, &binary_contents)) {
      Warn("unable to load binary file: " + filename);
      continue;
    }

    const uint8_t *binary =
        reinterpret_cast<const uint8_t *>(binary_contents.c_str());
    const size_t binary_size = binary_contents.size();
    const bool is_size_prefixed = options.opts.size_prefixed;

    flatbuffers::BinaryAnnotator binary_annotator(
        binary_schema, binary_schema_size, binary, binary_size,
        is_size_prefixed);

    auto annotations = binary_annotator.Annotate();

    flatbuffers::AnnotatedBinaryTextGenerator::Options text_gen_opts;
    text_gen_opts.include_vector_contents =
        options.annotate_include_vector_contents;

    // TODO(dbaileychess): Right now we just support a single text-based
    // output of the annotated binary schema, which we generate here. We
    // could output the raw annotations instead and have third-party tools
    // use them to generate their own output.
    flatbuffers::AnnotatedBinaryTextGenerator text_generator(
        text_gen_opts, annotations, binary, binary_size);

    text_generator.Generate(filename, schema_filename);
  }
}